

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O2

int Cgt_SimulationFilter(Cgt_Man_t *p,Aig_Obj_t *pCandPart,Aig_Obj_t *pMiterPart)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = ((p->nPatts >> 5) + 1) - (uint)((p->nPatts & 0x1fU) == 0);
  pvVar3 = Vec_PtrEntry(p->vPatts,*(int *)(((ulong)pCandPart & 0xfffffffffffffffe) + 0x24));
  pvVar4 = Vec_PtrEntry(p->vPatts,pMiterPart->Id);
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  uVar7 = 0;
  if (((ulong)pCandPart & 1) == 0) {
    do {
      if (uVar5 == uVar7) {
        return 1;
      }
      lVar1 = uVar7 * 4;
      lVar2 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while ((*(uint *)((long)pvVar3 + lVar2) & *(uint *)((long)pvVar4 + lVar1)) == 0);
  }
  else {
    do {
      if (uVar5 == uVar7) {
        return 1;
      }
      lVar1 = uVar7 * 4;
      lVar2 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while ((*(uint *)((long)pvVar4 + lVar2) & ~*(uint *)((long)pvVar3 + lVar1)) == 0);
  }
  return 0;
}

Assistant:

int Cgt_SimulationFilter( Cgt_Man_t * p, Aig_Obj_t * pCandPart, Aig_Obj_t * pMiterPart )
{
    unsigned * pInfoCand, * pInfoMiter;
    int w, nWords = Abc_BitWordNum( p->nPatts );  
    pInfoCand  = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(Aig_Regular(pCandPart)) );
    pInfoMiter = (unsigned *)Vec_PtrEntry( p->vPatts, Aig_ObjId(pMiterPart) );
    // C => !M -- true   is the same as    C & M -- false
    if ( !Aig_IsComplement(pCandPart) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pInfoCand[w] & pInfoMiter[w] )
                return 0;
    }
    return 1;
}